

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O2

string * cmVariableWatch::GetAccessAsString_abi_cxx11_(int access_type)

{
  int iVar1;
  allocator<char> local_26;
  allocator<char> local_25;
  allocator<char> local_24;
  allocator<char> local_23;
  allocator<char> local_22;
  allocator<char> local_21;
  
  if (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetAccessAsString[abi:cxx11](int)::
                                 cmVariableWatchAccessStrings_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_,
                 "READ_ACCESS",&local_21);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                  _M_elems + 1),"UNKNOWN_READ_ACCESS",&local_22);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                  _M_elems + 2),"UNKNOWN_DEFINED_ACCESS",&local_23);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                  _M_elems + 3),"MODIFIED_ACCESS",&local_24);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                  _M_elems + 4),"REMOVED_ACCESS",&local_25);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                  _M_elems + 5),"NO_ACCESS",&local_26);
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                   ::~array,&GetAccessAsString[abi:cxx11](int)::
                             cmVariableWatchAccessStrings_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetAccessAsString[abi:cxx11](int)::
                           cmVariableWatchAccessStrings_abi_cxx11_);
    }
  }
  iVar1 = 5;
  if ((uint)access_type < 5) {
    iVar1 = access_type;
  }
  return (string *)
         ((long)&GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_._M_elems
                 [0]._M_dataplus._M_p + (ulong)(uint)(iVar1 << 5));
}

Assistant:

const std::string& cmVariableWatch::GetAccessAsString(int access_type)
{
  static const std::array<std::string, 6> cmVariableWatchAccessStrings = {
    { "READ_ACCESS", "UNKNOWN_READ_ACCESS", "UNKNOWN_DEFINED_ACCESS",
      "MODIFIED_ACCESS", "REMOVED_ACCESS", "NO_ACCESS" }
  };
  if (access_type < 0 || access_type >= cmVariableWatch::NO_ACCESS) {
    access_type = cmVariableWatch::NO_ACCESS;
  }
  return cmVariableWatchAccessStrings[access_type];
}